

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsequ.c
# Opt level: O0

void zgsequ(SuperMatrix *A,double *r,double *c,double *rowcnd,double *colcnd,double *amax,int *info)

{
  double dVar1;
  double dVar2;
  double local_120;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int local_7c;
  double dStack_78;
  int ii;
  double smlnum;
  double bignum;
  double rcmax;
  double rcmin;
  int local_50;
  int irow;
  int_t j;
  int_t i;
  doublecomplex *Aval;
  NCformat *Astore;
  double *amax_local;
  double *colcnd_local;
  double *rowcnd_local;
  double *c_local;
  double *r_local;
  SuperMatrix *A_local;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_Z || (A->Mtype != SLU_GE)))) {
    *info = -1;
  }
  Astore = (NCformat *)amax;
  amax_local = colcnd;
  colcnd_local = rowcnd;
  rowcnd_local = c;
  c_local = r;
  r_local = (double *)A;
  if (*info == 0) {
    if ((A->nrow == 0) || (A->ncol == 0)) {
      *rowcnd = 1.0;
      *colcnd = 1.0;
      *amax = 0.0;
    }
    else {
      Aval = (doublecomplex *)A->Store;
      _j = Aval->i;
      dStack_78 = dmach("S");
      smlnum = 1.0 / dStack_78;
      for (irow = 0; irow < *(int *)((long)r_local + 0xc); irow = irow + 1) {
        c_local[irow] = 0.0;
      }
      for (local_50 = 0; local_50 < *(int *)(r_local + 2); local_50 = local_50 + 1) {
        for (irow = *(int *)((long)Aval[1].i + (long)local_50 * 4);
            irow < *(int *)((long)Aval[1].i + (long)(local_50 + 1) * 4); irow = irow + 1) {
          rcmin._4_4_ = *(int *)((long)Aval[1].r + (long)irow * 4);
          dVar1 = c_local[rcmin._4_4_];
          dVar2 = z_abs1((doublecomplex *)((long)_j + (long)irow * 0x10));
          if (dVar1 <= dVar2) {
            local_90 = z_abs1((doublecomplex *)((long)_j + (long)irow * 0x10));
          }
          else {
            local_90 = c_local[rcmin._4_4_];
          }
          c_local[rcmin._4_4_] = local_90;
        }
      }
      rcmax = smlnum;
      bignum = 0.0;
      for (irow = 0; irow < *(int *)((long)r_local + 0xc); irow = irow + 1) {
        if (bignum < c_local[irow] || bignum == c_local[irow]) {
          local_98 = c_local[irow];
        }
        else {
          local_98 = bignum;
        }
        bignum = local_98;
        if (c_local[irow] <= rcmax) {
          local_a0 = c_local[irow];
        }
        else {
          local_a0 = rcmax;
        }
        rcmax = local_a0;
      }
      *(double *)Astore = bignum;
      if ((rcmax != 0.0) || (NAN(rcmax))) {
        for (irow = 0; irow < *(int *)((long)r_local + 0xc); irow = irow + 1) {
          if (c_local[irow] <= dStack_78) {
            local_a8 = dStack_78;
          }
          else {
            local_a8 = c_local[irow];
          }
          if (smlnum <= local_a8) {
            local_b8 = smlnum;
          }
          else {
            if (c_local[irow] <= dStack_78) {
              local_b0 = dStack_78;
            }
            else {
              local_b0 = c_local[irow];
            }
            local_b8 = local_b0;
          }
          c_local[irow] = 1.0 / local_b8;
        }
        if (rcmax <= dStack_78) {
          local_c0 = dStack_78;
        }
        else {
          local_c0 = rcmax;
        }
        if (smlnum <= bignum) {
          local_d0 = smlnum;
        }
        else {
          local_d0 = bignum;
        }
        *colcnd_local = local_c0 / local_d0;
      }
      else {
        for (irow = 0; irow < *(int *)((long)r_local + 0xc); irow = irow + 1) {
          if ((c_local[irow] == 0.0) && (!NAN(c_local[irow]))) {
            *info = irow + 1;
            return;
          }
        }
      }
      for (local_50 = 0; local_50 < *(int *)(r_local + 2); local_50 = local_50 + 1) {
        rowcnd_local[local_50] = 0.0;
      }
      for (local_50 = 0; local_50 < *(int *)(r_local + 2); local_50 = local_50 + 1) {
        for (irow = *(int *)((long)Aval[1].i + (long)local_50 * 4);
            irow < *(int *)((long)Aval[1].i + (long)(local_50 + 1) * 4); irow = irow + 1) {
          rcmin._4_4_ = *(int *)((long)Aval[1].r + (long)irow * 4);
          dVar1 = rowcnd_local[local_50];
          dVar2 = z_abs1((doublecomplex *)((long)_j + (long)irow * 0x10));
          if (dVar1 <= dVar2 * c_local[rcmin._4_4_]) {
            local_e0 = z_abs1((doublecomplex *)((long)_j + (long)irow * 0x10));
            local_e0 = local_e0 * c_local[rcmin._4_4_];
          }
          else {
            local_e0 = rowcnd_local[local_50];
          }
          rowcnd_local[local_50] = local_e0;
        }
      }
      rcmax = smlnum;
      bignum = 0.0;
      for (local_50 = 0; local_50 < *(int *)(r_local + 2); local_50 = local_50 + 1) {
        if (bignum < rowcnd_local[local_50] || bignum == rowcnd_local[local_50]) {
          local_e8 = rowcnd_local[local_50];
        }
        else {
          local_e8 = bignum;
        }
        bignum = local_e8;
        if (rowcnd_local[local_50] <= rcmax) {
          local_f0 = rowcnd_local[local_50];
        }
        else {
          local_f0 = rcmax;
        }
        rcmax = local_f0;
      }
      if ((rcmax != 0.0) || (NAN(rcmax))) {
        for (local_50 = 0; local_50 < *(int *)(r_local + 2); local_50 = local_50 + 1) {
          if (rowcnd_local[local_50] <= dStack_78) {
            local_f8 = dStack_78;
          }
          else {
            local_f8 = rowcnd_local[local_50];
          }
          if (smlnum <= local_f8) {
            local_108 = smlnum;
          }
          else {
            if (rowcnd_local[local_50] <= dStack_78) {
              local_100 = dStack_78;
            }
            else {
              local_100 = rowcnd_local[local_50];
            }
            local_108 = local_100;
          }
          rowcnd_local[local_50] = 1.0 / local_108;
        }
        if (rcmax <= dStack_78) {
          local_110 = dStack_78;
        }
        else {
          local_110 = rcmax;
        }
        if (smlnum <= bignum) {
          local_120 = smlnum;
        }
        else {
          local_120 = bignum;
        }
        *amax_local = local_110 / local_120;
      }
      else {
        for (local_50 = 0; local_50 < *(int *)(r_local + 2); local_50 = local_50 + 1) {
          if ((rowcnd_local[local_50] == 0.0) && (!NAN(rowcnd_local[local_50]))) {
            *info = *(int *)((long)r_local + 0xc) + local_50 + 1;
            return;
          }
        }
      }
    }
  }
  else {
    local_7c = -*info;
    input_error("zgsequ",&local_7c);
  }
  return;
}

Assistant:

void
zgsequ(SuperMatrix *A, double *r, double *c, double *rowcnd,
	double *colcnd, double *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int_t i, j;
    int   irow;
    double rcmin, rcmax;
    double bignum, smlnum;
    extern double dmach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("zgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = dmach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], z_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], z_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}